

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIO.cpp
# Opt level: O0

void __thiscall Imf_3_4::OStream::~OStream(OStream *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__OStream_002ac738;
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  return;
}

Assistant:

OStream::~OStream ()
{
    // empty
}